

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

_Bool upb_strtable_resize(upb_strtable *t,size_t size_lg2,upb_Arena *a)

{
  _Bool _Var1;
  int iVar2;
  upb_value val;
  upb_StringView key;
  intptr_t iter;
  upb_strtable new_table;
  upb_value local_70;
  upb_StringView local_68;
  intptr_t local_58;
  upb_strtable local_50;
  
  iVar2 = init((EVP_PKEY_CTX *)&local_50);
  if ((char)iVar2 != '\0') {
    local_58 = -1;
    _Var1 = upb_strtable_next2(t,&local_68,&local_70,&local_58);
    if (_Var1) {
      do {
        upb_strtable_insert(&local_50,local_68.data,local_68.size,local_70,a);
        _Var1 = upb_strtable_next2(t,&local_68,&local_70,&local_58);
      } while (_Var1);
    }
    (t->t).size_lg2 = local_50.t.size_lg2;
    *(undefined7 *)&(t->t).field_0x11 = local_50.t._17_7_;
    (t->t).entries = local_50.t.entries;
    (t->t).count = local_50.t.count;
    (t->t).mask = local_50.t.mask;
    (t->t).max_count = local_50.t.max_count;
  }
  return (_Bool)(char)iVar2;
}

Assistant:

bool upb_strtable_resize(upb_strtable* t, size_t size_lg2, upb_Arena* a) {
  upb_strtable new_table;
  if (!init(&new_table.t, size_lg2, a)) return false;

  intptr_t iter = UPB_STRTABLE_BEGIN;
  upb_StringView key;
  upb_value val;
  while (upb_strtable_next2(t, &key, &val, &iter)) {
    upb_strtable_insert(&new_table, key.data, key.size, val, a);
  }
  *t = new_table;
  return true;
}